

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

bool __thiscall
andres::View<float,false,std::allocator<unsigned_long>>::
overlaps<float,true,std::allocator<unsigned_long>>
          (View<float,false,std::allocator<unsigned_long>> *this,
          View<float,_true,_std::allocator<unsigned_long>_> *v)

{
  reference pfVar1;
  reference pfVar2;
  size_t sVar3;
  reference pfVar4;
  reference pfVar5;
  void *maxPointerV;
  void *maxPointer;
  void *vDataPointer_;
  void *dataPointer_;
  View<float,_true,_std::allocator<unsigned_long>_> *v_local;
  View<float,_false,_std::allocator<unsigned_long>_> *this_local;
  
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(v);
  if ((*(long *)this == 0) || (v->data_ == (pointer)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    pfVar1 = *(reference *)this;
    pfVar2 = v->data_;
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::size
                      ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
    pfVar4 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<float,_false,_std::allocator<unsigned_long>_> *)this,sVar3 - 1);
    sVar3 = View<float,_true,_std::allocator<unsigned_long>_>::size(v);
    pfVar5 = View<float,_true,_std::allocator<unsigned_long>_>::operator()(v,sVar3 - 1);
    if (((pfVar2 < pfVar1) || (pfVar4 < pfVar2)) && ((pfVar1 < pfVar2 || (pfVar5 < pfVar1)))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool View<T, isConst, A>::overlaps
(
    const View<TLocal, isConstLocal, ALocal>& v
) const
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        v.testInvariant();
    }
    if(data_ == 0 || v.data_ == 0) {
        return false;
    }
    else {
        const void* dataPointer_ = data_;
        const void* vDataPointer_ = v.data_;
        const void* maxPointer = & (*this)(this->size()-1);
        const void* maxPointerV = & v(v.size()-1);
        if(    (dataPointer_   <= vDataPointer_ && vDataPointer_ <= maxPointer)
            || (vDataPointer_ <= dataPointer_   && dataPointer_   <= maxPointerV) )
        {
            return true;
        }
    }
    return false;
}